

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall PathParser::parse(PathParser *this)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  byte *pbVar4;
  Point PVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar9;
  Point p1;
  Point p2;
  Point local_b8;
  Point local_b0;
  Point local_a8;
  float local_9c;
  Point local_98;
  undefined8 uStack_90;
  Point local_88;
  undefined8 uStack_80;
  Point local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  string local_50;
  
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  local_98.x = 0.0;
  local_98.y = 0.0;
  uStack_90 = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  uStack_80 = 0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  uStack_70 = 0;
  do {
    sVar3 = (this->super_Parser).s.size;
    if (sVar3 == 0) {
      return;
    }
    pbVar4 = (byte *)(this->super_Parser).s.s;
    bVar1 = *pbVar4;
    (this->super_Parser).s.s = (char *)(pbVar4 + 1);
    (this->super_Parser).s.size = sVar3 - 1;
    Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
    switch(bVar1) {
    case 0x41:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        PVar5 = parse_point(this);
        local_68._8_4_ = extraout_XMM0_Dc_00;
        local_68._0_4_ = PVar5.x;
        local_68._4_4_ = PVar5.y;
        local_68._12_4_ = extraout_XMM0_Dd_00;
        local_9c = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        fVar8 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        fVar7 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        local_b8 = parse_point(this);
        Path::arc_to(this->path,(Point)local_68._0_8_,local_9c,(bool)(-(fVar8 != 0.0) & 1),
                     (bool)(-(fVar7 != 0.0) & 1),&local_b8);
      }
      break;
    case 0x42:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x52:
    case 0x55:
switchD_00107d32_caseD_62:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"unexpected command",(allocator<char> *)&local_b0);
      Parser::error(&this->super_Parser,&local_50);
    case 0x43:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b0 = parse_point(this);
        local_a8 = parse_point(this);
        local_b8 = parse_point(this);
        Path::curve_to(this->path,&local_b0,&local_a8,&local_b8);
        local_98 = local_a8;
        uStack_90 = 0;
      }
      break;
    case 0x48:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        fVar8 = Parser::parse_number(&this->super_Parser);
        local_b8.x = fVar8;
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        Path::line_to(this->path,&local_b8);
      }
      break;
    case 0x4c:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b8 = parse_point(this);
        Path::line_to(this->path,&local_b8);
      }
      break;
    case 0x4d:
      local_b8 = parse_point(this);
      Path::move_to(this->path,&local_b8);
      local_78 = local_b8;
      uStack_70 = 0;
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b8 = parse_point(this);
        Path::line_to(this->path,&local_b8);
      }
      break;
    case 0x51:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b0 = parse_point(this);
        local_b8 = parse_point(this);
        Path::quadratic_curve_to(this->path,&local_b0,&local_b8);
        local_88 = local_b0;
        uStack_80 = 0;
      }
      break;
    case 0x53:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b0.y = (local_b8.y + local_b8.y) - local_98.y;
        local_b0.x = (local_b8.x + local_b8.x) - local_98.x;
        local_a8 = parse_point(this);
        local_b8 = parse_point(this);
        Path::curve_to(this->path,&local_b0,&local_a8,&local_b8);
        local_98 = local_a8;
        uStack_90 = 0;
      }
      break;
    case 0x54:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        local_b0.y = (local_b8.y + local_b8.y) - local_88.y;
        local_b0.x = (local_b8.x + local_b8.x) - local_88.x;
        local_b8 = parse_point(this);
        Path::quadratic_curve_to(this->path,&local_b0,&local_b8);
        local_88 = local_b0;
        uStack_80 = 0;
      }
      break;
    case 0x56:
      while (((this->super_Parser).s.size != 0 &&
             (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
        fVar8 = Parser::parse_number(&this->super_Parser);
        local_b8.y = fVar8;
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        Path::line_to(this->path,&local_b8);
      }
      break;
    default:
      switch(bVar1) {
      case 0x61:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          PVar5 = parse_point(this);
          local_68._8_4_ = extraout_XMM0_Dc;
          local_68._0_4_ = PVar5.x;
          local_68._4_4_ = PVar5.y;
          local_68._12_4_ = extraout_XMM0_Dd;
          local_9c = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          fVar8 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          fVar7 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          PVar5 = parse_point(this);
          fVar9 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar9 + PVar5.y;
          Path::arc_to(this->path,(Point)local_68._0_8_,local_9c,(bool)(-(fVar8 != 0.0) & 1),
                       (bool)(-(fVar7 != 0.0) & 1),&local_b8);
        }
        break;
      case 0x62:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x72:
      case 0x75:
        goto switchD_00107d32_caseD_62;
      case 99:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          PVar5 = parse_point(this);
          local_b0.x = local_b8.x + PVar5.x;
          local_b0.y = local_b8.y + PVar5.y;
          PVar5 = parse_point(this);
          local_a8.x = local_b8.x + PVar5.x;
          local_a8.y = local_b8.y + PVar5.y;
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::curve_to(this->path,&local_b0,&local_a8,&local_b8);
          local_98 = local_a8;
          uStack_90 = 0;
        }
        break;
      case 0x68:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          fVar8 = Parser::parse_number(&this->super_Parser);
          local_b8.x = fVar8 + local_b8.x;
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          Path::line_to(this->path,&local_b8);
        }
        break;
      case 0x6c:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::line_to(this->path,&local_b8);
        }
        break;
      case 0x6d:
        PVar5 = parse_point(this);
        fVar8 = local_b8.y;
        local_b8.x = local_b8.x + PVar5.x;
        local_b8.y = fVar8 + PVar5.y;
        Path::move_to(this->path,&local_b8);
        local_78 = local_b8;
        uStack_70 = 0;
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::line_to(this->path,&local_b8);
        }
        break;
      case 0x71:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          PVar5 = parse_point(this);
          local_b0.x = local_b8.x + PVar5.x;
          local_b0.y = local_b8.y + PVar5.y;
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::quadratic_curve_to(this->path,&local_b0,&local_b8);
          local_88 = local_b0;
          uStack_80 = 0;
        }
        break;
      case 0x73:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          local_b0.y = (local_b8.y + local_b8.y) - local_98.y;
          local_b0.x = (local_b8.x + local_b8.x) - local_98.x;
          PVar5 = parse_point(this);
          local_a8.x = local_b8.x + PVar5.x;
          local_a8.y = local_b8.y + PVar5.y;
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::curve_to(this->path,&local_b0,&local_a8,&local_b8);
          local_98 = local_a8;
          uStack_90 = 0;
        }
        break;
      case 0x74:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          local_b0.y = (local_b8.y + local_b8.y) - local_88.y;
          local_b0.x = (local_b8.x + local_b8.x) - local_88.x;
          PVar5 = parse_point(this);
          fVar8 = local_b8.y;
          local_b8.x = local_b8.x + PVar5.x;
          local_b8.y = fVar8 + PVar5.y;
          Path::quadratic_curve_to(this->path,&local_b0,&local_b8);
          local_88 = local_b0;
          uStack_80 = 0;
        }
        break;
      case 0x76:
        while (((this->super_Parser).s.size != 0 &&
               (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10))) {
          fVar8 = Parser::parse_number(&this->super_Parser);
          local_b8.y = fVar8 + local_b8.y;
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
          Path::line_to(this->path,&local_b8);
        }
        break;
      default:
        if ((bVar1 != 0x5a) && (bVar1 != 0x7a)) goto switchD_00107d32_caseD_62;
        (this->path->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].closed = true;
        local_b8 = local_78;
        goto LAB_00108511;
      }
    }
    if (bVar1 == 0x43) goto LAB_0010852a;
LAB_00108511:
    if ((bVar1 - 0x53 < 0x21) && ((0x100010001U >> ((ulong)(bVar1 - 0x53) & 0x3f) & 1) != 0))
    goto LAB_0010852a;
    local_98 = local_b8;
    uStack_90 = 0;
    uVar6 = bVar1 - 0x51;
    if ((0x23 < uVar6) || ((0x900000009U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
LAB_0010852a:
      local_88 = local_b8;
      uStack_80 = 0;
    }
  } while( true );
}

Assistant:

void parse() {
		Point current_point(0.f, 0.f);
		Point initial_point(0.f, 0.f);
		Point cubic_p2(0.f, 0.f);
		Point quadratic_p1(0.f, 0.f);
		parse_all(white_space);
		while (has_next()) {
			const Character command = next();
			parse_all(white_space);
			if (command == 'M') {
				current_point = parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'm') {
				current_point = current_point + parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'L') {
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'l') {
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'H') {
				while (copy().parse(number_start_char)) {
					current_point.x = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'h') {
				while (copy().parse(number_start_char)) {
					current_point.x += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'V') {
				while (copy().parse(number_start_char)) {
					current_point.y = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'v') {
				while (copy().parse(number_start_char)) {
					current_point.y += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'C') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'c') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'S') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 's') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'Q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'T') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 't') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'A') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'a') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = current_point + parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'Z' || command == 'z') {
				path.close();
				current_point = initial_point;
			}
			else {
				error("unexpected command");
			}
			if (command != 'C' && command != 'c' && command != 'S' && command != 's') {
				cubic_p2 = current_point;
			}
			if (command != 'Q' && command != 'q' && command != 'T' && command != 't') {
				quadratic_p1 = current_point;
			}
		}
	}